

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O1

void blend_a64_vmask_w16n_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  long lVar1;
  undefined1 in_XMM0 [16];
  undefined1 auVar2 [16];
  short sVar3;
  short sVar5;
  undefined1 auVar4 [16];
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 in_XMM4 [16];
  short sVar14;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 in_XMM5 [16];
  undefined1 auVar15 [16];
  short sVar22;
  undefined1 in_XMM6 [16];
  undefined1 auVar23 [16];
  
  auVar2 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    if (0 < w) {
      auVar4 = pshuflw(ZEXT116(*mask),ZEXT116(*mask),0);
      sVar3 = auVar4._0_2_;
      sVar6 = auVar2._0_2_ - sVar3;
      sVar5 = auVar4._2_2_;
      sVar7 = auVar2._2_2_ - sVar5;
      sVar8 = auVar2._4_2_ - sVar3;
      sVar9 = auVar2._6_2_ - sVar5;
      sVar10 = auVar2._8_2_ - sVar3;
      sVar11 = auVar2._10_2_ - sVar5;
      sVar12 = auVar2._12_2_ - sVar3;
      sVar13 = auVar2._14_2_ - sVar5;
      lVar1 = 0;
      do {
        auVar4 = pmovzxbw(in_XMM4,*(undefined8 *)(src0 + lVar1));
        auVar15 = pmovzxbw(in_XMM5,*(undefined8 *)(src1 + lVar1));
        auVar23._0_2_ = auVar4._0_2_ * sVar3;
        auVar23._2_2_ = auVar4._2_2_ * sVar5;
        auVar23._4_2_ = auVar4._4_2_ * sVar3;
        auVar23._6_2_ = auVar4._6_2_ * sVar5;
        auVar23._8_2_ = auVar4._8_2_ * sVar3;
        auVar23._10_2_ = auVar4._10_2_ * sVar5;
        auVar23._12_2_ = auVar4._12_2_ * sVar3;
        auVar23._14_2_ = auVar4._14_2_ * sVar5;
        auVar4 = pmovzxbw(auVar23,*(undefined8 *)(src0 + lVar1 + 8));
        sVar14 = pavgw((ushort)(auVar15._0_2_ * sVar6 + auVar23._0_2_) >> 5,0);
        sVar16 = pavgw((ushort)(auVar15._2_2_ * sVar7 + auVar23._2_2_) >> 5,0);
        sVar17 = pavgw((ushort)(auVar15._4_2_ * sVar8 + auVar23._4_2_) >> 5,0);
        sVar18 = pavgw((ushort)(auVar15._6_2_ * sVar9 + auVar23._6_2_) >> 5,0);
        sVar19 = pavgw((ushort)(auVar15._8_2_ * sVar10 + auVar23._8_2_) >> 5,0);
        sVar20 = pavgw((ushort)(auVar15._10_2_ * sVar11 + auVar23._10_2_) >> 5,0);
        sVar21 = pavgw((ushort)(auVar15._12_2_ * sVar12 + auVar23._12_2_) >> 5,0);
        sVar22 = pavgw((ushort)(auVar15._14_2_ * sVar13 + auVar23._14_2_) >> 5,0);
        auVar23 = pmovzxbw(in_XMM6,*(undefined8 *)(src1 + lVar1 + 8));
        in_XMM4._0_2_ = auVar4._0_2_ * sVar3;
        in_XMM4._2_2_ = auVar4._2_2_ * sVar5;
        in_XMM4._4_2_ = auVar4._4_2_ * sVar3;
        in_XMM4._6_2_ = auVar4._6_2_ * sVar5;
        in_XMM4._8_2_ = auVar4._8_2_ * sVar3;
        in_XMM4._10_2_ = auVar4._10_2_ * sVar5;
        in_XMM4._12_2_ = auVar4._12_2_ * sVar3;
        in_XMM4._14_2_ = auVar4._14_2_ * sVar5;
        in_XMM6._0_2_ = pavgw((ushort)(auVar23._0_2_ * sVar6 + in_XMM4._0_2_) >> 5,0);
        in_XMM6._2_2_ = pavgw((ushort)(auVar23._2_2_ * sVar7 + in_XMM4._2_2_) >> 5,0);
        in_XMM6._4_2_ = pavgw((ushort)(auVar23._4_2_ * sVar8 + in_XMM4._4_2_) >> 5,0);
        in_XMM6._6_2_ = pavgw((ushort)(auVar23._6_2_ * sVar9 + in_XMM4._6_2_) >> 5,0);
        in_XMM6._8_2_ = pavgw((ushort)(auVar23._8_2_ * sVar10 + in_XMM4._8_2_) >> 5,0);
        in_XMM6._10_2_ = pavgw((ushort)(auVar23._10_2_ * sVar11 + in_XMM4._10_2_) >> 5,0);
        in_XMM6._12_2_ = pavgw((ushort)(auVar23._12_2_ * sVar12 + in_XMM4._12_2_) >> 5,0);
        in_XMM6._14_2_ = pavgw((ushort)(auVar23._14_2_ * sVar13 + in_XMM4._14_2_) >> 5,0);
        in_XMM5[1] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
        in_XMM5[0] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
        in_XMM5[2] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
        in_XMM5[3] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
        in_XMM5[4] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
        in_XMM5[5] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
        in_XMM5[6] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
        in_XMM5[7] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
        in_XMM5[8] = (0 < in_XMM6._0_2_) * (in_XMM6._0_2_ < 0x100) * (char)in_XMM6._0_2_ -
                     (0xff < in_XMM6._0_2_);
        in_XMM5[9] = (0 < in_XMM6._2_2_) * (in_XMM6._2_2_ < 0x100) * (char)in_XMM6._2_2_ -
                     (0xff < in_XMM6._2_2_);
        in_XMM5[10] = (0 < in_XMM6._4_2_) * (in_XMM6._4_2_ < 0x100) * (char)in_XMM6._4_2_ -
                      (0xff < in_XMM6._4_2_);
        in_XMM5[0xb] = (0 < in_XMM6._6_2_) * (in_XMM6._6_2_ < 0x100) * (char)in_XMM6._6_2_ -
                       (0xff < in_XMM6._6_2_);
        in_XMM5[0xc] = (0 < in_XMM6._8_2_) * (in_XMM6._8_2_ < 0x100) * (char)in_XMM6._8_2_ -
                       (0xff < in_XMM6._8_2_);
        in_XMM5[0xd] = (0 < in_XMM6._10_2_) * (in_XMM6._10_2_ < 0x100) * (char)in_XMM6._10_2_ -
                       (0xff < in_XMM6._10_2_);
        in_XMM5[0xe] = (0 < in_XMM6._12_2_) * (in_XMM6._12_2_ < 0x100) * (char)in_XMM6._12_2_ -
                       (0xff < in_XMM6._12_2_);
        in_XMM5[0xf] = (0 < in_XMM6._14_2_) * (in_XMM6._14_2_ < 0x100) * (char)in_XMM6._14_2_ -
                       (0xff < in_XMM6._14_2_);
        *(undefined1 (*) [16])(dst + lVar1) = in_XMM5;
        lVar1 = lVar1 + 0x10;
      } while (lVar1 < w);
    }
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    mask = mask + 1;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_vmask_w16n_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                        const uint8_t *src0,
                                        uint32_t src0_stride,
                                        const uint8_t *src1,
                                        uint32_t src1_stride,
                                        const uint8_t *mask, int w, int h) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    const __m128i v_m0_w = _mm_set1_epi16(*mask);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);
    for (c = 0; c < w; c += 16) {
      const __m128i v_resl_w = blend_8(src0 + c, src1 + c, &v_m0_w, &v_m1_w);
      const __m128i v_resh_w =
          blend_8(src0 + c + 8, src1 + c + 8, &v_m0_w, &v_m1_w);

      const __m128i v_res_b = _mm_packus_epi16(v_resl_w, v_resh_w);

      xx_storeu_128(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 1;
  } while (--h);
}